

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Map.hpp
# Opt level: O2

Perfect<Kernel::MonomFactors<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>
* __thiscall
Lib::
Map<const_Kernel::MonomFactors<Kernel::NumTraits<Kernel::RealConstantType>_>_*,_Lib::Perfect<Kernel::MonomFactors<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>,_Lib::DerefPtrHash<Lib::StlHash>_>
::insert(Map<const_Kernel::MonomFactors<Kernel::NumTraits<Kernel::RealConstantType>_>_*,_Lib::Perfect<Kernel::MonomFactors<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>,_Lib::DerefPtrHash<Lib::StlHash>_>
         *this,MonomFactors<Kernel::NumTraits<Kernel::RealConstantType>_> **key,
        Perfect<Kernel::MonomFactors<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>
        *val,uint code)

{
  uint uVar1;
  MonomFactors<Kernel::NumTraits<Kernel::RealConstantType>_> *pMVar2;
  bool bVar3;
  Entry *pEVar4;
  Entry *pEVar5;
  
  pEVar4 = this->_entries;
  pEVar5 = pEVar4 + (ulong)code % (ulong)(uint)this->_capacity;
  while (pEVar5->code != 0) {
    if (pEVar5->code == code) {
      bVar3 = Stack<Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_>::operator==
                        ((Stack<Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_>
                          *)pEVar5->_key,&(*key)->_factors);
      if (bVar3) goto LAB_0028e6d1;
      pEVar4 = this->_entries;
    }
    pEVar5 = pEVar5 + 1;
    if (pEVar5 == this->_afterLast) {
      pEVar5 = pEVar4;
    }
  }
  this->_noOfEntries = this->_noOfEntries + 1;
  uVar1 = val->_id;
  pMVar2 = val->_ptr;
  pEVar5->_key = (MaybeUninit<const_Kernel::MonomFactors<Kernel::NumTraits<RealConstantType>_>_*>)
                 *key;
  *(uint *)&pEVar5->_value = uVar1;
  *(MonomFactors<Kernel::NumTraits<Kernel::RealConstantType>_> **)((long)&pEVar5->_value + 8) =
       pMVar2;
  pEVar5->code = code;
LAB_0028e6d1:
  return (Perfect<Kernel::MonomFactors<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>
          *)&pEVar5->_value;
}

Assistant:

Val& insert(Key&& key, Val&& val,unsigned code)
  {
    Entry* entry;
    for (entry = firstEntryForCode(code); entry->occupied(); entry = nextEntry(entry)) {
      if (entry->code == code && Hash::equals(entry->key(),key)) {
        return entry->value();
      }
    }
    // entry is not occupied
    _noOfEntries++;
    entry->init(std::move(key), std::move(val), code);
    return entry->value();
  }